

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O3

void __thiscall
Js::JavascriptRegExpConstructor::JavascriptRegExpConstructor
          (JavascriptRegExpConstructor *this,DynamicType *type,ConstructorCache *cache)

{
  char *addr;
  JavascriptString *pJVar1;
  long lVar2;
  
  RuntimeFunction::RuntimeFunction
            (&this->super_RuntimeFunction,type,
             (FunctionInfo *)JavascriptRegExp::EntryInfo::NewInstance,cache);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0152f8e8;
  (this->lastPattern).ptr = (RegexPattern *)0x0;
  (this->lastInput).ptr = (JavascriptString *)0x0;
  (this->lastMatch).offset = 0;
  (this->lastMatch).length = 0xffffffff;
  this->invalidatedLastMatch = false;
  this->reset = false;
  (this->lastParen).ptr = (void *)0x0;
  (this->lastIndex).ptr = (void *)0x0;
  (this->index).ptr = (void *)0x0;
  (this->leftContext).ptr = (void *)0x0;
  (this->rightContext).ptr = (void *)0x0;
  this->captures[0].ptr = (void *)0x0;
  this->captures[1].ptr = (void *)0x0;
  this->captures[2].ptr = (void *)0x0;
  this->captures[3].ptr = (void *)0x0;
  this->captures[4].ptr = (void *)0x0;
  this->captures[5].ptr = (void *)0x0;
  this->captures[6].ptr = (void *)0x0;
  this->captures[7].ptr = (void *)0x0;
  this->captures[8].ptr = (void *)0x0;
  this->captures[9].ptr = (void *)0x0;
  JavascriptFunction::VerifyEntryPoint((JavascriptFunction *)this);
  pJVar1 = JavascriptLibrary::GetEmptyString
                     ((((((((this->super_RuntimeFunction).super_JavascriptFunction.
                            super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary)
                         .ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                      super_ScriptContextBase).javascriptLibrary);
  Memory::Recycler::WBSetBit((char *)&this->lastInput);
  (this->lastInput).ptr = pJVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastInput);
  Memory::Recycler::WBSetBit((char *)&this->index);
  (this->index).ptr = &DAT_10000ffffffff;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->index);
  Memory::Recycler::WBSetBit((char *)&this->lastIndex);
  (this->lastIndex).ptr = &DAT_10000ffffffff;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastIndex);
  Memory::Recycler::WBSetBit((char *)&this->lastParen);
  (this->lastParen).ptr = pJVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastParen);
  Memory::Recycler::WBSetBit((char *)&this->leftContext);
  (this->leftContext).ptr = pJVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->leftContext);
  Memory::Recycler::WBSetBit((char *)&this->rightContext);
  (this->rightContext).ptr = pJVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->rightContext);
  lVar2 = 0;
  do {
    addr = (char *)((long)&this->captures[0].ptr + lVar2);
    Memory::Recycler::WBSetBit(addr);
    *(JavascriptString **)((long)&this->captures[0].ptr + lVar2) = pJVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x50);
  return;
}

Assistant:

JavascriptRegExpConstructor::JavascriptRegExpConstructor(DynamicType* type, ConstructorCache* cache) :
        RuntimeFunction(type, &JavascriptRegExp::EntryInfo::NewInstance, cache),
        reset(false),
        invalidatedLastMatch(false),
        lastPattern(nullptr),
        lastMatch() // undefined
    {
        DebugOnly(VerifyEntryPoint());
        ScriptContext* scriptContext = this->GetScriptContext();
        JavascriptString* emptyString = scriptContext->GetLibrary()->GetEmptyString();
        this->lastInput = emptyString;
        this->index = JavascriptNumber::ToVar(-1, scriptContext);
        this->lastIndex = JavascriptNumber::ToVar(-1, scriptContext);
        this->lastParen = emptyString;
        this->leftContext = emptyString;
        this->rightContext = emptyString;
        for (int i = 0; i < NumCtorCaptures; i++)
        {
            this->captures[i] = emptyString;
        }
    }